

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O3

void testExistingStreams(string *tempDir)

{
  ulong uVar1;
  float *pfVar2;
  float fVar3;
  pointer pcVar4;
  Rgba RVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  char *pcVar12;
  int *piVar13;
  ulong uVar14;
  void *pvVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  undefined4 uVar18;
  long lVar19;
  int h;
  int extraout_EDX;
  int extraout_EDX_00;
  char *pcVar20;
  char *pcVar21;
  bool bVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Compression local_3bc;
  Header header;
  half hStack_3a6;
  half hStack_3a4;
  half hStack_3a2;
  ulong local_3a0;
  ulong local_398;
  ulong *local_390;
  ulong *local_388;
  ofstream *local_380;
  RgbaOutputFile out_1;
  half hStack_36e;
  half hStack_36c;
  half hStack_36a;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_368;
  ulong local_360;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_350;
  undefined8 local_348;
  RgbaOutputFile out;
  half hStack_33e;
  half hStack_33c;
  half hStack_33a;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_338;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_328;
  StdOFStream ofs;
  undefined4 local_300;
  undefined1 uStack_2fc;
  undefined1 uStack_2fb;
  undefined2 uStack_2fa;
  long *local_2d0;
  void *local_2c8;
  ulong local_2c0;
  MultiPartOutputFile out_5;
  long local_2a8 [2];
  ios_base *local_298;
  undefined8 local_290;
  long local_288;
  string *local_280;
  string strEXRFile;
  MultiPartOutputFile out_4;
  ofstream os;
  filebuf local_230 [8];
  char local_228 [232];
  ios_base aiStack_140 [272];
  
  local_280 = tempDir;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing reading and writing using existing streams",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_288 = _VTT;
  local_290 = _TypedAttribute;
  local_298 = aiStack_140;
  local_3bc = NO_COMPRESSION;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression: ",0xd);
    plVar11 = (long *)std::ostream::operator<<(&std::cout,local_3bc);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    pcVar12 = (char *)operator_new__(0x37158);
    anon_unknown.dwarf_1579e2::fillPixels1((Array2D<Imf_3_4::Rgba> *)0x77,(int)pcVar12,h);
    _out_1 = (Rgba)&local_360;
    pcVar4 = (local_280->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out_1,pcVar4,pcVar4 + local_280->_M_string_length);
    std::__cxx11::string::append((char *)&out_1);
    RVar5 = _out_1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based file:",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove((char *)RVar5);
    std::ofstream::ofstream(&os);
    std::filebuf::open((char *)local_230,RVar5._0_4_);
    Imf_3_4::StdOFStream::StdOFStream(&ofs,&os,(char *)RVar5);
    _out = 0;
    hStack_33e._h = 0;
    hStack_33c._h = 0;
    hStack_33a._h = 0;
    Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,local_3bc);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&ofs,&header,WRITE_RGBA,iVar8);
    Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pcVar12,1);
    Imf_3_4::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_4::Header::~Header(&header);
    Imf_3_4::StdOFStream::~StdOFStream(&ofs);
    _os = local_288;
    *(undefined8 *)(&os + *(long *)(local_288 + -0x18)) = local_290;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(local_298);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,RVar5._0_4_);
    Imf_3_4::StdIFStream::StdIFStream((StdIFStream *)&header,(ifstream *)&os,(char *)RVar5);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&header,iVar8);
    piVar13 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar8 = *piVar13;
    lVar27 = (long)piVar13[2] - (long)iVar8;
    uVar1 = lVar27 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar28 = iVar9 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar8 * -8 + (long)-iVar10 * uVar1 * 8,1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar13[1]);
    cVar7 = Imf_3_4::isLossyCompression(local_3bc);
    if (cVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
      if (-1 < iVar9) {
        pcVar20 = pcVar12 + 6;
        lVar23 = (long)pvVar15 + 6;
        uVar25 = 0;
        do {
          if (-1 < (int)lVar27) {
            uVar14 = 0;
            do {
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -6 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -6) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x14b,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -4 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -4) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x14c,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -2 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -2) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x14d,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x14e,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              uVar14 = uVar14 + 1;
            } while ((uVar1 & 0xffffffff) != uVar14);
          }
          uVar25 = uVar25 + 1;
          pcVar20 = pcVar20 + 0x3b8;
          lVar23 = lVar23 + uVar1 * 8;
        } while (uVar25 != uVar28);
      }
    }
    operator_delete__(pvVar15);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_4::StdIFStream::~StdIFStream((StdIFStream *)&header);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_1579e2::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)RVar5);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar8);
    piVar13 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar8 = *piVar13;
    lVar27 = (long)piVar13[2] - (long)iVar8;
    uVar1 = lVar27 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar28 = iVar9 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar8 * -8 + (long)-iVar10 * uVar1 * 8,1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar13[1]);
    cVar7 = Imf_3_4::isLossyCompression(local_3bc);
    if (cVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
      if (-1 < iVar9) {
        pcVar20 = pcVar12 + 6;
        lVar23 = (long)pvVar15 + 6;
        uVar25 = 0;
        do {
          if (-1 < (int)lVar27) {
            uVar14 = 0;
            do {
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -6 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -6) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x16a,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -4 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -4) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x16b,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -2 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -2) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x16c,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x16d,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              uVar14 = uVar14 + 1;
            } while ((uVar1 & 0xffffffff) != uVar14);
          }
          uVar25 = uVar25 + 1;
          pcVar20 = pcVar20 + 0x3b8;
          lVar23 = lVar23 + uVar1 * 8;
        } while (uVar25 != uVar28);
      }
    }
    operator_delete__(pvVar15);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    anon_unknown.dwarf_1579e2::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped, passthru)",0x23);
    anon_unknown.dwarf_1579e2::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)RVar5);
    Imf_3_4::IStream::IStream((IStream *)&header,"");
    _header = &PTR__IStream_001e81b8;
    local_380 = &os;
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&header,iVar8);
    piVar13 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar8 = *piVar13;
    lVar27 = (long)piVar13[2] - (long)iVar8;
    uVar1 = lVar27 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar28 = iVar9 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar8 * -8 + (long)-iVar10 * uVar1 * 8,1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar13[1]);
    cVar7 = Imf_3_4::isLossyCompression(local_3bc);
    if (cVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
      if (-1 < iVar9) {
        pcVar20 = pcVar12 + 6;
        lVar23 = (long)pvVar15 + 6;
        uVar25 = 0;
        do {
          if (-1 < (int)lVar27) {
            uVar14 = 0;
            do {
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -6 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -6) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x18b,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -4 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -4) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x18c,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -2 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -2) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x18d,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x18e,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              uVar14 = uVar14 + 1;
            } while ((uVar1 & 0xffffffff) != uVar14);
          }
          uVar25 = uVar25 + 1;
          pcVar20 = pcVar20 + 0x3b8;
          lVar23 = lVar23 + uVar1 * 8;
        } while (uVar25 != uVar28);
      }
    }
    operator_delete__(pvVar15);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_4::IStream::~IStream((IStream *)&header);
    anon_unknown.dwarf_1579e2::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    remove((char *)RVar5);
    if (_out_1 != (Rgba)&local_360) {
      operator_delete((void *)_out_1,local_360 + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based stringstream:",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    strEXRFile._M_dataplus._M_p = (pointer)&strEXRFile.field_2;
    strEXRFile._M_string_length = 0;
    strEXRFile.field_2._M_local_buf[0] = '\0';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_4::StdOSStream::StdOSStream((StdOSStream *)&os);
    _header = 0;
    hStack_3a6._h = 0;
    hStack_3a4._h = 0;
    hStack_3a2._h = 0;
    Imf_3_4::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaOutputFile::RgbaOutputFile(&out_1,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,iVar8);
    Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&out_1,(ulong)pcVar12,1);
    Imf_3_4::RgbaOutputFile::writePixels((int)(Rgba *)&out_1);
    Imf_3_4::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&strEXRFile,(string *)&header);
    if (_header != (undefined **)&local_398) {
      operator_delete(_header,local_398 + 1);
    }
    Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&out_1);
    Imf_3_4::Header::~Header((Header *)&ofs);
    Imf_3_4::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_4::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_4::StdISStream::clear();
    Imf_3_4::StdISStream::str((string *)&os);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar8);
    piVar13 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar8 = *piVar13;
    lVar27 = (long)piVar13[2] - (long)iVar8;
    uVar1 = lVar27 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar28 = iVar9 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar8 * -8 + (long)-iVar10 * uVar1 * 8,1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar13[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
    if (-1 < iVar9) {
      pcVar20 = pcVar12 + 6;
      lVar23 = (long)pvVar15 + 6;
      uVar25 = 0;
      do {
        if (-1 < (int)lVar27) {
          uVar14 = 0;
          do {
            fVar3 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar23 + -6 + uVar14 * 8) * 4);
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -6) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x322,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar3 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar23 + -4 + uVar14 * 8) * 4);
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -4) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x323,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar3 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar23 + -2 + uVar14 * 8) * 4);
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -2) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x324,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar3 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar23 + uVar14 * 8) * 4);
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar20 + uVar14 * 8) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x325,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            uVar14 = uVar14 + 1;
          } while ((uVar1 & 0xffffffff) != uVar14);
        }
        uVar25 = uVar25 + 1;
        pcVar20 = pcVar20 + 0x3b8;
        lVar23 = lVar23 + uVar1 * 8;
      } while (uVar25 != uVar28);
    }
    operator_delete__(pvVar15);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_4::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    testExistingStreams();
    _out_1 = (Rgba)&local_360;
    pcVar4 = (local_280->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out_1,pcVar4,pcVar4 + local_280->_M_string_length);
    std::__cxx11::string::append((char *)&out_1);
    RVar5 = _out_1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tiled file:",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove((char *)RVar5);
    std::ofstream::ofstream(&os);
    std::filebuf::open((char *)local_230,RVar5._0_4_);
    Imf_3_4::StdOFStream::StdOFStream(&ofs,&os,(char *)RVar5);
    _out = 0;
    hStack_33e._h = 0;
    hStack_33c._h = 0;
    hStack_33a._h = 0;
    Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,local_3bc);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&ofs,&header,WRITE_RGBA,0x14,0x14,ONE_LEVEL,
               ROUND_DOWN,iVar8);
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pcVar12,1);
    iVar9 = (int)(Rgba *)&out;
    iVar8 = Imf_3_4::TiledRgbaOutputFile::numXTiles(iVar9);
    iVar10 = Imf_3_4::TiledRgbaOutputFile::numYTiles(iVar9);
    Imf_3_4::TiledRgbaOutputFile::writeTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
    Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_4::Header::~Header(&header);
    Imf_3_4::StdOFStream::~StdOFStream(&ofs);
    _os = local_288;
    *(undefined8 *)(&os + *(long *)(local_288 + -0x18)) = local_290;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(local_298);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,RVar5._0_4_);
    Imf_3_4::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,(char *)RVar5);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&header,(IStream *)&ofs,iVar8);
    piVar13 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    iVar8 = *piVar13;
    lVar27 = (long)piVar13[2] - (long)iVar8;
    uVar1 = lVar27 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar28 = iVar9 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&header,(long)pvVar15 + (long)iVar8 * -8 + (long)-iVar10 * uVar1 * 8,1);
    iVar8 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
    iVar10 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
    Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar8 + -1,0,iVar10 + -1);
    cVar7 = Imf_3_4::isLossyCompression(local_3bc);
    if (cVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
      if (-1 < iVar9) {
        pcVar20 = pcVar12 + 6;
        lVar23 = (long)pvVar15 + 6;
        uVar25 = 0;
        do {
          if (-1 < (int)lVar27) {
            uVar14 = 0;
            do {
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -6 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -6) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2c2,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -4 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -4) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2c3,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -2 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -2) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2c4,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2c5,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              uVar14 = uVar14 + 1;
            } while ((uVar1 & 0xffffffff) != uVar14);
          }
          uVar25 = uVar25 + 1;
          pcVar20 = pcVar20 + 0x3b8;
          lVar23 = lVar23 + uVar1 * 8;
        } while (uVar25 != uVar28);
      }
    }
    operator_delete__(pvVar15);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_3_4::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_1579e2::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)RVar5);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar8)
    ;
    piVar13 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    iVar8 = *piVar13;
    lVar27 = (long)piVar13[2] - (long)iVar8;
    uVar1 = lVar27 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar28 = iVar9 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar8 * -8 + (long)-iVar10 * uVar1 * 8,1);
    iVar8 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&ofs);
    iVar10 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&ofs);
    Imf_3_4::TiledRgbaInputFile::readTiles((int)&ofs,0,iVar8 + -1,0,iVar10 + -1);
    cVar7 = Imf_3_4::isLossyCompression(local_3bc);
    if (cVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
      if (-1 < iVar9) {
        pcVar20 = pcVar12 + 6;
        lVar23 = (long)pvVar15 + 6;
        uVar25 = 0;
        do {
          if (-1 < (int)lVar27) {
            uVar14 = 0;
            do {
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -6 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -6) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2e1,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -4 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -4) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2e2,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -2 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -2) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2e3,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + uVar14 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar20 + uVar14 * 8) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2e4,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              uVar14 = uVar14 + 1;
            } while ((uVar1 & 0xffffffff) != uVar14);
          }
          uVar25 = uVar25 + 1;
          pcVar20 = pcVar20 + 0x3b8;
          lVar23 = lVar23 + uVar1 * 8;
        } while (uVar25 != uVar28);
      }
    }
    operator_delete__(pvVar15);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    anon_unknown.dwarf_1579e2::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    remove((char *)RVar5);
    if (_out_1 != (Rgba)&local_360) {
      operator_delete((void *)_out_1,local_360 + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"tiled stringstream:",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    _header = (undefined **)&local_398;
    local_3a0 = 0;
    local_398 = local_398 & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_4::StdOSStream::StdOSStream((StdOSStream *)&os);
    _out_1 = 0;
    hStack_36e._h = 0;
    hStack_36c._h = 0;
    hStack_36a._h = 0;
    Imf_3_4::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&out_1,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,0x14,0x14,
               ONE_LEVEL,ROUND_DOWN,iVar8);
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pcVar12,1);
    iVar9 = (int)(Rgba *)&out;
    iVar8 = Imf_3_4::TiledRgbaOutputFile::numXTiles(iVar9);
    iVar10 = Imf_3_4::TiledRgbaOutputFile::numYTiles(iVar9);
    Imf_3_4::TiledRgbaOutputFile::writeTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
    Imf_3_4::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&out_1);
    if (_out_1 != (Rgba)&local_360) {
      operator_delete((void *)_out_1,local_360 + 1);
    }
    Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_4::Header::~Header((Header *)&ofs);
    Imf_3_4::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_4::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_4::StdISStream::clear();
    Imf_3_4::StdISStream::str((string *)&os);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar8)
    ;
    piVar13 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    iVar8 = *piVar13;
    lVar27 = (long)piVar13[2] - (long)iVar8;
    uVar1 = lVar27 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar28 = iVar9 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar8 * -8 + (long)-iVar10 * uVar1 * 8,1);
    iVar24 = (int)(Rgba *)&ofs;
    iVar8 = Imf_3_4::TiledRgbaInputFile::numXTiles(iVar24);
    iVar10 = Imf_3_4::TiledRgbaInputFile::numYTiles(iVar24);
    Imf_3_4::TiledRgbaInputFile::readTiles(iVar24,0,iVar8 + -1,0,iVar10 + -1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
    if (-1 < iVar9) {
      pcVar20 = pcVar12 + 6;
      lVar23 = (long)pvVar15 + 6;
      uVar25 = 0;
      do {
        if (-1 < (int)lVar27) {
          uVar14 = 0;
          do {
            fVar3 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar23 + -6 + uVar14 * 8) * 4);
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -6) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3f3,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar3 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar23 + -4 + uVar14 * 8) * 4);
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -4) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3f4,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar3 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar23 + -2 + uVar14 * 8) * 4);
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar20 + uVar14 * 8 + -2) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3f5,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar3 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar23 + uVar14 * 8) * 4);
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar20 + uVar14 * 8) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3f6,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            uVar14 = uVar14 + 1;
          } while ((uVar1 & 0xffffffff) != uVar14);
        }
        uVar25 = uVar25 + 1;
        pcVar20 = pcVar20 + 0x3b8;
        lVar23 = lVar23 + uVar1 * 8;
      } while (uVar25 != uVar28);
    }
    operator_delete__(pvVar15);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    Imf_3_4::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    iVar8 = extraout_EDX;
    if (_header != (undefined **)&local_398) {
      operator_delete(_header,local_398 + 1);
      iVar8 = extraout_EDX_00;
    }
    anon_unknown.dwarf_1579e2::fillPixels1((Array2D<Imf_3_4::Rgba> *)0x77,(int)pcVar12,iVar8);
    _out_5 = local_2a8;
    pcVar4 = (local_280->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out_5,pcVar4,pcVar4 + local_280->_M_string_length);
    std::__cxx11::string::append((char *)&out_5);
    local_2d0 = _out_5;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based multipart file:",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove((char *)local_2d0);
    std::ofstream::ofstream(&os);
    plVar11 = local_2d0;
    std::filebuf::open((char *)local_230,(_Ios_Openmode)local_2d0);
    Imf_3_4::StdOFStream::StdOFStream(&ofs,&os,(char *)plVar11);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out,2,
               (allocator_type *)&header);
    _out_1 = 0;
    hStack_36e._h = 0;
    hStack_36c._h = 0;
    hStack_36a._h = 0;
    Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out_1,1.0,INCREASING_Y,local_3bc);
    Imf_3_4::Header::operator=((Header *)_out,&header);
    Imf_3_4::Header::~Header(&header);
    local_3a0 = 5;
    local_398 = CONCAT26(local_398._6_2_,0x3174726170);
    _header = (undefined **)&local_398;
    Imf_3_4::Header::setName((string *)_out);
    if (_header != (undefined **)&local_398) {
      operator_delete(_header,local_398 + 1);
    }
    pcVar20 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar20,(Channel *)0x1b882b);
    pcVar20 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar20,(Channel *)0x1b883e);
    pcVar20 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar20,(Channel *)0x1b8851);
    pcVar20 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar20,(Channel *)0x1c2189);
    Imf_3_4::Header::setType((string *)_out);
    Imf_3_4::Header::operator=((Header *)((long)_out + 0x38),(Header *)_out);
    local_3a0 = 5;
    local_398 = CONCAT26(local_398._6_2_,0x3274726170);
    _header = (undefined **)&local_398;
    Imf_3_4::Header::setName((string *)((long)_out + 0x38));
    if (_header != (undefined **)&local_398) {
      operator_delete(_header,local_398 + 1);
    }
    RVar5 = _out;
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (&out_4,(OStream *)&ofs,(Header *)RVar5,2,false,iVar8);
    local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)local_368 & 0xffffffff00000000);
    local_360 = 0;
    local_358 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_368;
    local_348 = 0;
    local_350 = local_358;
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,pcVar12,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&out_1,(Slice *)0x1b882b);
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,pcVar12 + 2,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&out_1,(Slice *)0x1b883e);
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,pcVar12 + 4,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&out_1,(Slice *)0x1b8851);
    pcVar20 = pcVar12 + 6;
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,pcVar20,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&out_1,(Slice *)0x1c2189);
    iVar8 = 0;
    bVar6 = true;
    do {
      bVar22 = bVar6;
      Imf_3_4::OutputPart::OutputPart((OutputPart *)&header,&out_4,iVar8);
      Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_4::OutputPart::writePixels((int)(OutputPart *)&header);
      iVar8 = 1;
      bVar6 = false;
    } while (bVar22);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&out_1);
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&out_4);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out);
    Imf_3_4::StdOFStream::~StdOFStream(&ofs);
    _os = local_288;
    *(undefined8 *)(&os + *(long *)(local_288 + -0x18)) = local_290;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(local_298);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    plVar11 = local_2d0;
    std::filebuf::open(local_228,(_Ios_Openmode)local_2d0);
    Imf_3_4::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,(char *)plVar11);
    iVar8 = Imf_3_4::globalThreadCount();
    uVar18 = 1;
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out,(IStream *)&ofs,iVar8,true);
    iVar8 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar8 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1f8,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    puVar16 = (undefined8 *)Imf_3_4::Header::dataWindow();
    Imf_3_4::MultiPartInputFile::header((int)&out);
    puVar17 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar8 = -(uint)((int)*puVar17 == (int)*puVar16);
    iVar10 = -(uint)((int)((ulong)*puVar17 >> 0x20) == (int)((ulong)*puVar16 >> 0x20));
    auVar29._4_4_ = iVar8;
    auVar29._0_4_ = iVar8;
    auVar29._8_4_ = iVar10;
    auVar29._12_4_ = iVar10;
    iVar8 = movmskpd(uVar18,auVar29);
    if ((iVar8 != 3) ||
       (iVar8 = -(uint)((int)puVar17[1] == (int)puVar16[1]),
       iVar10 = -(uint)((int)((ulong)puVar17[1] >> 0x20) == (int)((ulong)puVar16[1] >> 0x20)),
       auVar30._4_4_ = iVar8, auVar30._0_4_ = iVar8, auVar30._8_4_ = iVar10, auVar30._12_4_ = iVar10
       , iVar8 = movmskpd((int)puVar17,auVar30), iVar8 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1fa,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    piVar13 = (int *)Imf_3_4::Header::dataWindow();
    iVar8 = piVar13[2];
    lVar27 = (long)*piVar13;
    uVar1 = (iVar8 - lVar27) + 1;
    iVar10 = piVar13[1];
    uVar28 = piVar13[3] - iVar10;
    local_2c0 = (ulong)uVar28;
    uVar28 = uVar28 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)local_368 & 0xffffffff00000000);
    local_360 = 0;
    local_358 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_368;
    local_348 = 0;
    lVar23 = (long)-iVar10 * uVar1;
    uVar25 = uVar1 * 8;
    local_350 = local_358;
    local_2c8 = pvVar15;
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar15 + lVar27 * -8 + lVar23 * 8),8,uVar25,1,1
               ,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&out_1,(Slice *)0x1b882b);
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar15 + lVar27 * -8 + 2 + lVar23 * 8),8,uVar25
               ,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&out_1,(Slice *)0x1b883e);
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar15 + lVar27 * -8 + 4 + lVar23 * 8),8,uVar25
               ,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&out_1,(Slice *)0x1b8851);
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar15 + lVar27 * -8 + 6 + lVar23 * 8),8,uVar25
               ,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&out_1,(Slice *)0x1c2189);
    lVar23 = (long)local_2c8 + 6;
    iVar10 = 0;
    bVar6 = true;
    do {
      bVar22 = bVar6;
      Imf_3_4::InputPart::InputPart((InputPart *)&header,(MultiPartInputFile *)&out,iVar10);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_4::InputPart::readPixels((int)&header,piVar13[1]);
      cVar7 = Imf_3_4::isLossyCompression(local_3bc);
      if (cVar7 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", comparing pt ",0xf);
        std::ostream::operator<<(&std::cout,iVar10);
        if (-1 < (int)local_2c0) {
          uVar14 = 0;
          lVar19 = lVar23;
          pcVar21 = pcVar20;
          do {
            if (-1 < (int)(iVar8 - lVar27)) {
              uVar26 = 0;
              do {
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar19 + -6 + uVar26 * 8) * 4);
                pfVar2 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar21 + uVar26 * 8 + -6) * 4);
                if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x22e,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar19 + -4 + uVar26 * 8) * 4);
                pfVar2 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar21 + uVar26 * 8 + -4) * 4);
                if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x22f,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar19 + -2 + uVar26 * 8) * 4);
                pfVar2 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar21 + uVar26 * 8 + -2) * 4);
                if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x230,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar19 + uVar26 * 8) * 4);
                pfVar2 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar21 + uVar26 * 8) * 4);
                if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x231,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                uVar26 = uVar26 + 1;
              } while ((uVar1 & 0xffffffff) != uVar26);
            }
            uVar14 = uVar14 + 1;
            pcVar21 = pcVar21 + 0x3b8;
            lVar19 = lVar19 + uVar25;
          } while (uVar14 != uVar28);
        }
      }
      iVar10 = 1;
      bVar6 = false;
    } while (bVar22);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&out_1);
    operator_delete__(local_2c8);
    if (local_328 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328);
    }
    if (local_338 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338);
    }
    Imf_3_4::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_1579e2::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)local_2d0);
    iVar8 = Imf_3_4::globalThreadCount();
    uVar18 = 1;
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out_1,(IStream *)&os,iVar8,true);
    iVar8 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar8 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x23d,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out_1);
    puVar16 = (undefined8 *)Imf_3_4::Header::dataWindow();
    Imf_3_4::MultiPartInputFile::header((int)&out_1);
    puVar17 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar8 = -(uint)((int)*puVar17 == (int)*puVar16);
    iVar10 = -(uint)((int)((ulong)*puVar17 >> 0x20) == (int)((ulong)*puVar16 >> 0x20));
    auVar31._4_4_ = iVar8;
    auVar31._0_4_ = iVar8;
    auVar31._8_4_ = iVar10;
    auVar31._12_4_ = iVar10;
    iVar8 = movmskpd(uVar18,auVar31);
    if ((iVar8 != 3) ||
       (iVar8 = -(uint)((int)puVar17[1] == (int)puVar16[1]),
       iVar10 = -(uint)((int)((ulong)puVar17[1] >> 0x20) == (int)((ulong)puVar16[1] >> 0x20)),
       auVar32._4_4_ = iVar8, auVar32._0_4_ = iVar8, auVar32._8_4_ = iVar10, auVar32._12_4_ = iVar10
       , iVar8 = movmskpd((int)puVar17,auVar32), iVar8 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x23f,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out_1);
    piVar13 = (int *)Imf_3_4::Header::dataWindow();
    iVar8 = piVar13[2];
    lVar27 = (long)*piVar13;
    uVar1 = (iVar8 - lVar27) + 1;
    iVar10 = piVar13[1];
    uVar28 = piVar13[3] - iVar10;
    local_2c0 = (ulong)uVar28;
    uVar28 = uVar28 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    local_3a0 = local_3a0 & 0xffffffff00000000;
    local_398 = 0;
    local_390 = &local_3a0;
    local_380 = (ofstream *)0x0;
    lVar23 = (long)-iVar10 * uVar1;
    uVar25 = uVar1 * 8;
    local_388 = local_390;
    local_2c8 = pvVar15;
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar27 * -8 + lVar23 * 8),8,uVar25,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b882b);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar27 * -8 + 2 + lVar23 * 8),8,uVar25,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b883e);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar27 * -8 + 4 + lVar23 * 8),8,uVar25,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b8851);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar27 * -8 + 6 + lVar23 * 8),8,uVar25,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1c2189);
    lVar23 = (long)local_2c8 + 6;
    iVar10 = 0;
    bVar6 = true;
    do {
      bVar22 = bVar6;
      Imf_3_4::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&out_1,iVar10);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_4::InputPart::readPixels((int)&ofs,piVar13[1]);
      cVar7 = Imf_3_4::isLossyCompression(local_3bc);
      if (cVar7 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", comparing pt ",0xf);
        std::ostream::operator<<(&std::cout,iVar10);
        if (-1 < (int)local_2c0) {
          uVar14 = 0;
          lVar19 = lVar23;
          pcVar21 = pcVar20;
          do {
            if (-1 < (int)(iVar8 - lVar27)) {
              uVar26 = 0;
              do {
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar19 + -6 + uVar26 * 8) * 4);
                pfVar2 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar21 + uVar26 * 8 + -6) * 4);
                if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x273,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar19 + -4 + uVar26 * 8) * 4);
                pfVar2 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar21 + uVar26 * 8 + -4) * 4);
                if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x274,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar19 + -2 + uVar26 * 8) * 4);
                pfVar2 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar21 + uVar26 * 8 + -2) * 4);
                if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x275,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar19 + uVar26 * 8) * 4);
                pfVar2 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar21 + uVar26 * 8) * 4);
                if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x276,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                uVar26 = uVar26 + 1;
              } while ((uVar1 & 0xffffffff) != uVar26);
            }
            uVar14 = uVar14 + 1;
            pcVar21 = pcVar21 + 0x3b8;
            lVar19 = lVar19 + uVar25;
          } while (uVar14 != uVar28);
        }
      }
      iVar10 = 1;
      bVar6 = false;
    } while (bVar22);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&header);
    operator_delete__(local_2c8);
    if (local_358 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358);
    }
    if (local_368 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368);
    }
    anon_unknown.dwarf_1579e2::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    remove((char *)local_2d0);
    if (_out_5 != local_2a8) {
      operator_delete(_out_5,local_2a8[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based multipart stringstream:",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    _out_1 = (Rgba)&local_360;
    local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_360 = local_360 & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_4::StdOSStream::StdOSStream((StdOSStream *)&os);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out,2,
               (allocator_type *)&ofs);
    _header = 0;
    hStack_3a6._h = 0;
    hStack_3a4._h = 0;
    hStack_3a2._h = 0;
    Imf_3_4::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
    Imf_3_4::Header::operator=((Header *)_out,(Header *)&ofs);
    Imf_3_4::Header::~Header((Header *)&ofs);
    uStack_2fc = 0x31;
    local_300 = 0x74726170;
    uStack_2fb = 0;
    _ofs = (Rgba)&local_300;
    Imf_3_4::Header::setName((string *)_out);
    if (_ofs != (Rgba)&local_300) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_2fa,CONCAT15(uStack_2fb,CONCAT14(uStack_2fc,local_300))) + 1);
    }
    pcVar21 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar21,(Channel *)0x1b882b);
    pcVar21 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar21,(Channel *)0x1b883e);
    pcVar21 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar21,(Channel *)0x1b8851);
    pcVar21 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar21,(Channel *)0x1c2189);
    Imf_3_4::Header::setType((string *)_out);
    Imf_3_4::Header::operator=((Header *)((long)_out + 0x38),(Header *)_out);
    uStack_2fc = 0x32;
    local_300 = 0x74726170;
    uStack_2fb = 0;
    _ofs = (Rgba)&local_300;
    Imf_3_4::Header::setName((string *)((long)_out + 0x38));
    if (_ofs != (Rgba)&local_300) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_2fa,CONCAT15(uStack_2fb,CONCAT14(uStack_2fc,local_300))) + 1);
    }
    RVar5 = _out;
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (&out_5,(OStream *)&os,(Header *)RVar5,2,false,iVar8);
    local_3a0 = local_3a0 & 0xffffffff00000000;
    local_398 = 0;
    local_390 = &local_3a0;
    local_380 = (ofstream *)0x0;
    local_388 = local_390;
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,pcVar12,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b882b);
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,pcVar12 + 2,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b883e);
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,pcVar12 + 4,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b8851);
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,pcVar20,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1c2189);
    iVar8 = 0;
    bVar6 = true;
    do {
      bVar22 = bVar6;
      Imf_3_4::OutputPart::OutputPart((OutputPart *)&ofs,&out_5,iVar8);
      Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_4::OutputPart::writePixels((int)(OutputPart *)&ofs);
      iVar8 = 1;
      bVar6 = false;
    } while (bVar22);
    Imf_3_4::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&out_1,(string *)&ofs);
    if (_ofs != (Rgba)&local_300) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_2fa,CONCAT15(uStack_2fb,CONCAT14(uStack_2fc,local_300))) + 1);
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&header);
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&out_5);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out);
    Imf_3_4::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_4::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_4::StdISStream::clear();
    Imf_3_4::StdISStream::str((string *)&os);
    iVar8 = Imf_3_4::globalThreadCount();
    uVar18 = 1;
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out,(IStream *)&os,iVar8,true);
    iVar8 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar8 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x380,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    puVar16 = (undefined8 *)Imf_3_4::Header::dataWindow();
    Imf_3_4::MultiPartInputFile::header((int)&out);
    puVar17 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar8 = -(uint)((int)*puVar17 == (int)*puVar16);
    iVar10 = -(uint)((int)((ulong)*puVar17 >> 0x20) == (int)((ulong)*puVar16 >> 0x20));
    auVar33._4_4_ = iVar8;
    auVar33._0_4_ = iVar8;
    auVar33._8_4_ = iVar10;
    auVar33._12_4_ = iVar10;
    iVar8 = movmskpd(uVar18,auVar33);
    if ((iVar8 != 3) ||
       (iVar8 = -(uint)((int)puVar17[1] == (int)puVar16[1]),
       iVar10 = -(uint)((int)((ulong)puVar17[1] >> 0x20) == (int)((ulong)puVar16[1] >> 0x20)),
       auVar34._4_4_ = iVar8, auVar34._0_4_ = iVar8, auVar34._8_4_ = iVar10, auVar34._12_4_ = iVar10
       , iVar8 = movmskpd((int)puVar17,auVar34), iVar8 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x382,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    piVar13 = (int *)Imf_3_4::Header::dataWindow();
    iVar8 = piVar13[2];
    lVar27 = (long)*piVar13;
    uVar1 = (iVar8 - lVar27) + 1;
    iVar10 = piVar13[1];
    uVar28 = piVar13[3] - iVar10;
    local_2c0 = (ulong)uVar28;
    uVar28 = uVar28 + 1;
    uVar14 = (long)(int)uVar28 * uVar1;
    uVar25 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar25);
    local_3a0 = local_3a0 & 0xffffffff00000000;
    local_398 = 0;
    local_390 = &local_3a0;
    local_380 = (ofstream *)0x0;
    lVar23 = (long)-iVar10 * uVar1;
    uVar25 = uVar1 * 8;
    local_388 = local_390;
    local_2d0 = (long *)pvVar15;
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar27 * -8 + lVar23 * 8),8,uVar25,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b882b);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar27 * -8 + lVar23 * 8 + 2),8,uVar25,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b883e);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar27 * -8 + lVar23 * 8 + 4),8,uVar25,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b8851);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar27 * -8 + lVar23 * 8 + 6),8,uVar25,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1c2189);
    lVar23 = (long)local_2d0 + 6;
    iVar10 = 0;
    bVar6 = true;
    do {
      bVar22 = bVar6;
      Imf_3_4::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&out,iVar10);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_4::InputPart::readPixels((int)&ofs,piVar13[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,", comparing pt ",0xf);
      std::ostream::operator<<(&std::cout,iVar10);
      if (-1 < (int)local_2c0) {
        uVar14 = 0;
        lVar19 = lVar23;
        pcVar21 = pcVar20;
        do {
          if (-1 < (int)(iVar8 - lVar27)) {
            uVar26 = 0;
            do {
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar19 + -6 + uVar26 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar26 * 8 + -6) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x3b4,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar19 + -4 + uVar26 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar26 * 8 + -4) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x3b5,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar19 + -2 + uVar26 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar26 * 8 + -2) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x3b6,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar19 + uVar26 * 8) * 4);
              pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar26 * 8) * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x3b7,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              uVar26 = uVar26 + 1;
            } while ((uVar1 & 0xffffffff) != uVar26);
          }
          uVar14 = uVar14 + 1;
          pcVar21 = pcVar21 + 0x3b8;
          lVar19 = lVar19 + uVar25;
        } while (uVar14 != uVar28);
      }
      iVar10 = 1;
      bVar6 = false;
    } while (bVar22);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&header);
    operator_delete__(local_2d0);
    if (local_328 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328);
    }
    if (local_338 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338);
    }
    Imf_3_4::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    if (_out_1 != (Rgba)&local_360) {
      operator_delete((void *)_out_1,local_360 + 1);
    }
    operator_delete__(pcVar12);
    local_3bc = local_3bc + RLE_COMPRESSION;
    if (local_3bc == NUM_COMPRESSION_METHODS) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testExistingStreams (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading and writing using existing streams" << endl;

        const int W = 119;
        const int H = 237;

        for (int compression = 0; compression < NUM_COMPRESSION_METHODS;
             ++compression)
        {
            cout << "compression: " << compression << endl;

            Array2D<Rgba> p1 (H, W);

            fillPixels1 (p1, W, H);
            writeReadScanLines (
                (tempDir + "imf_test_streams.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadScanLines (W, H, p1);

            fillPixels2 (p1, W, H);
            writeReadTiles (
                (tempDir + "imf_test_streams2.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadTiles (W, H, p1);

            fillPixels1 (p1, W, H);
            writeReadMultiPart (
                (tempDir + "imf_test_streams3.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadMultiPart (W, H, p1);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}